

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::V1LayerParameter::SharedDtor(V1LayerParameter *this)

{
  string *default_value;
  V1LayerParameter *pVVar1;
  V1LayerParameter *this_local;
  
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->name_,default_value);
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->layer_ != (V0LayerParameter *)0x0)) {
    (*(this->layer_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->concat_param_ != (ConcatParameter *)0x0)) {
    (*(this->concat_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->convolution_param_ != (ConvolutionParameter *)0x0)) {
    (*(this->convolution_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->data_param_ != (DataParameter *)0x0)) {
    (*(this->data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->dropout_param_ != (DropoutParameter *)0x0)) {
    (*(this->dropout_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->hdf5_data_param_ != (HDF5DataParameter *)0x0)) {
    (*(this->hdf5_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->hdf5_output_param_ != (HDF5OutputParameter *)0x0)) {
    (*(this->hdf5_output_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->image_data_param_ != (ImageDataParameter *)0x0)) {
    (*(this->image_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->infogain_loss_param_ != (InfogainLossParameter *)0x0)) {
    (*(this->infogain_loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->inner_product_param_ != (InnerProductParameter *)0x0)) {
    (*(this->inner_product_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->lrn_param_ != (LRNParameter *)0x0)) {
    (*(this->lrn_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->pooling_param_ != (PoolingParameter *)0x0)) {
    (*(this->pooling_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->window_data_param_ != (WindowDataParameter *)0x0)) {
    (*(this->window_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->power_param_ != (PowerParameter *)0x0)) {
    (*(this->power_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->memory_data_param_ != (MemoryDataParameter *)0x0)) {
    (*(this->memory_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->argmax_param_ != (ArgMaxParameter *)0x0)) {
    (*(this->argmax_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->eltwise_param_ != (EltwiseParameter *)0x0)) {
    (*(this->eltwise_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->threshold_param_ != (ThresholdParameter *)0x0)) {
    (*(this->threshold_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->dummy_data_param_ != (DummyDataParameter *)0x0)) {
    (*(this->dummy_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->accuracy_param_ != (AccuracyParameter *)0x0)) {
    (*(this->accuracy_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->hinge_loss_param_ != (HingeLossParameter *)0x0)) {
    (*(this->hinge_loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->relu_param_ != (ReLUParameter *)0x0)) {
    (*(this->relu_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->slice_param_ != (SliceParameter *)0x0)) {
    (*(this->slice_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->mvn_param_ != (MVNParameter *)0x0)) {
    (*(this->mvn_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->transform_param_ != (TransformationParameter *)0x0)) {
    (*(this->transform_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->tanh_param_ != (TanHParameter *)0x0)) {
    (*(this->tanh_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->sigmoid_param_ != (SigmoidParameter *)0x0)) {
    (*(this->sigmoid_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->softmax_param_ != (SoftmaxParameter *)0x0)) {
    (*(this->softmax_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->contrastive_loss_param_ != (ContrastiveLossParameter *)0x0)) {
    (*(this->contrastive_loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->exp_param_ != (ExpParameter *)0x0)) {
    (*(this->exp_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar1 = internal_default_instance();
  if ((this != pVVar1) && (this->loss_param_ != (LossParameter *)0x0)) {
    (*(this->loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void V1LayerParameter::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete layer_;
  }
  if (this != internal_default_instance()) {
    delete concat_param_;
  }
  if (this != internal_default_instance()) {
    delete convolution_param_;
  }
  if (this != internal_default_instance()) {
    delete data_param_;
  }
  if (this != internal_default_instance()) {
    delete dropout_param_;
  }
  if (this != internal_default_instance()) {
    delete hdf5_data_param_;
  }
  if (this != internal_default_instance()) {
    delete hdf5_output_param_;
  }
  if (this != internal_default_instance()) {
    delete image_data_param_;
  }
  if (this != internal_default_instance()) {
    delete infogain_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete inner_product_param_;
  }
  if (this != internal_default_instance()) {
    delete lrn_param_;
  }
  if (this != internal_default_instance()) {
    delete pooling_param_;
  }
  if (this != internal_default_instance()) {
    delete window_data_param_;
  }
  if (this != internal_default_instance()) {
    delete power_param_;
  }
  if (this != internal_default_instance()) {
    delete memory_data_param_;
  }
  if (this != internal_default_instance()) {
    delete argmax_param_;
  }
  if (this != internal_default_instance()) {
    delete eltwise_param_;
  }
  if (this != internal_default_instance()) {
    delete threshold_param_;
  }
  if (this != internal_default_instance()) {
    delete dummy_data_param_;
  }
  if (this != internal_default_instance()) {
    delete accuracy_param_;
  }
  if (this != internal_default_instance()) {
    delete hinge_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete relu_param_;
  }
  if (this != internal_default_instance()) {
    delete slice_param_;
  }
  if (this != internal_default_instance()) {
    delete mvn_param_;
  }
  if (this != internal_default_instance()) {
    delete transform_param_;
  }
  if (this != internal_default_instance()) {
    delete tanh_param_;
  }
  if (this != internal_default_instance()) {
    delete sigmoid_param_;
  }
  if (this != internal_default_instance()) {
    delete softmax_param_;
  }
  if (this != internal_default_instance()) {
    delete contrastive_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete exp_param_;
  }
  if (this != internal_default_instance()) {
    delete loss_param_;
  }
}